

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall
cppjieba::DictTrie::CalculateWeight
          (DictTrie *this,
          vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *node_infos,double sum)

{
  size_type sVar1;
  reference pvVar2;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_RSI;
  double in_XMM0_Qa;
  double dVar3;
  DictUnit *node_info;
  size_t i;
  ulong local_20;
  
  if (in_XMM0_Qa <= 0.0) {
    __assert_fail("sum > 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
                  ,0xfc,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const"
                 );
  }
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(in_RSI);
    if (sVar1 <= local_20) {
      return;
    }
    pvVar2 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                       (in_RSI,local_20);
    if (pvVar2->weight <= 0.0) break;
    dVar3 = log(pvVar2->weight / in_XMM0_Qa);
    pvVar2->weight = dVar3;
    local_20 = local_20 + 1;
  }
  __assert_fail("node_info.weight > 0.0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
                ,0xff,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const");
}

Assistant:

void CalculateWeight(vector<DictUnit>& node_infos, double sum) const {
    assert(sum > 0.0);
    for (size_t i = 0; i < node_infos.size(); i++) {
      DictUnit& node_info = node_infos[i];
      assert(node_info.weight > 0.0);
      node_info.weight = log(double(node_info.weight)/sum);
    }
  }